

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O1

void __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpAId>_>
::DecreaseStepWhileErrorTooBig
          (BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpAId>_>
           *this,double x0,double f0,double *dx0)

{
  int iVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar2;
  
  (*this->_vptr_BasicPLApproximator[9])(*dx0 + x0);
  dVar2 = extraout_XMM0_Qa;
  if ((extraout_XMM0_Qa != f0) || (NAN(extraout_XMM0_Qa) || NAN(f0))) {
    do {
      iVar1 = (*this->_vptr_BasicPLApproximator[0x1b])(x0,f0,*dx0 + x0,dVar2,this);
      if (iVar1 < 1) {
        return;
      }
      dVar2 = *dx0;
      *dx0 = dVar2 * 0.9090909090909091;
      (*this->_vptr_BasicPLApproximator[9])(dVar2 * 0.9090909090909091 + x0,this);
      dVar2 = extraout_XMM0_Qa_00;
    } while ((extraout_XMM0_Qa_00 != f0) || (NAN(extraout_XMM0_Qa_00) || NAN(f0)));
  }
  return;
}

Assistant:

void BasicPLApproximator<FuncCon>::DecreaseStepWhileErrorTooBig(
    double x0, double f0, double& dx0) {
  double f1;
  while ( (f1=eval(x0+dx0))!=f0 &&          // same value
          0 < CompareError(x0, f0, x0+dx0, f1) ) {
    dx0 *= (1.0 / 1.1);
  }
}